

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamhdr.c
# Opt level: O2

void nn_streamhdr_start(nn_streamhdr *self,nn_usock *usock,nn_pipebase *pipebase)

{
  char *pcVar1;
  undefined8 uStack_30;
  int protocol;
  size_t sz;
  
  if ((self->usock == (nn_usock *)0x0) && ((self->usock_owner).fsm == (nn_fsm *)0x0)) {
    (self->usock_owner).src = 1;
    (self->usock_owner).fsm = &self->fsm;
    nn_usock_swap_owner(usock,&self->usock_owner);
    self->usock = usock;
    self->pipebase = pipebase;
    sz = 4;
    nn_pipebase_getopt(pipebase,0,0xd,&protocol,&sz);
    if (sz == 4) {
      self->protohdr[0] = '\0';
      self->protohdr[1] = 'S';
      self->protohdr[2] = 'P';
      self->protohdr[3] = '\0';
      self->protohdr[4] = '\0';
      self->protohdr[5] = '\0';
      self->protohdr[6] = '\0';
      self->protohdr[7] = '\0';
      nn_puts(self->protohdr + 4,(uint16_t)protocol);
      nn_fsm_start(&self->fsm);
      return;
    }
    pcVar1 = "sz == sizeof (protocol)";
    uStack_30 = 99;
  }
  else {
    pcVar1 = "self->usock == NULL && self->usock_owner.fsm == NULL";
    uStack_30 = 0x59;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/utils/streamhdr.c"
          ,uStack_30);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_streamhdr_start (struct nn_streamhdr *self, struct nn_usock *usock,
    struct nn_pipebase *pipebase)
{
    size_t sz;
    int protocol;

    /*  Take ownership of the underlying socket. */
    nn_assert (self->usock == NULL && self->usock_owner.fsm == NULL);
    self->usock_owner.src = NN_STREAMHDR_SRC_USOCK;
    self->usock_owner.fsm = &self->fsm;
    nn_usock_swap_owner (usock, &self->usock_owner);
    self->usock = usock;
    self->pipebase = pipebase;

    /*  Get the protocol identifier. */
    sz = sizeof (protocol);
    nn_pipebase_getopt (pipebase, NN_SOL_SOCKET, NN_PROTOCOL, &protocol, &sz);
    nn_assert (sz == sizeof (protocol));

    /*  Compose the protocol header. */
    memcpy (self->protohdr, "\0SP\0\0\0\0\0", 8);
    nn_puts (self->protohdr + 4, (uint16_t) protocol);

    /*  Launch the state machine. */
    nn_fsm_start (&self->fsm);
}